

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

base_learner * Search::setup(options_i *options,vw *all)

{
  long *plVar1;
  char *pcVar2;
  double dVar3;
  byte bVar4;
  undefined1 uVar5;
  int iVar6;
  int iVar7;
  pointer psVar8;
  typed_option<float> *filename;
  polylabel *ppVar9;
  ostream *poVar10;
  undefined8 uVar11;
  clock_t cVar12;
  learner<Search::search,_std::vector<example_*,_std::allocator<example_*>_>_> *this;
  id in_RSI;
  learner<Search::search,_std::vector<example_*,_std::allocator<example_*>_>_> *in_RDI;
  learner<Search::search,_std::vector<example_*,_std::allocator<example_*>_>_> *l;
  base_learner *base;
  stringstream __msg_4;
  search_metatask **mytask_3;
  stringstream __msg_3;
  search_task **mytask_2;
  search_metatask **mytask_1;
  search_task **mytask;
  uint32_t tmp_number_of_policies;
  stringstream __msg_2;
  stringstream __msg_1;
  stringstream __msg;
  option_group_definition new_options;
  string search_allowed_transitions;
  uint32_t search_trained_nb_policies;
  string rollin_string;
  string rollout_string;
  string neighbor_features_string;
  string interpolation_string;
  string metatask_string;
  string task_string;
  search_private *priv;
  free_ptr<search> sch;
  string *in_stack_ffffffffffffd8b8;
  vw *in_stack_ffffffffffffd8c0;
  string *in_stack_ffffffffffffd8c8;
  typed_option<float> *in_stack_ffffffffffffd8d0;
  undefined4 in_stack_ffffffffffffd8d8;
  undefined4 in_stack_ffffffffffffd8dc;
  uint uVar13;
  undefined8 in_stack_ffffffffffffd8e0;
  learner<Search::search,_std::vector<example_*,_std::allocator<example_*>_>_> *plVar14;
  string *in_stack_ffffffffffffd8e8;
  allocator *paVar15;
  vw_exception *in_stack_ffffffffffffd8f0;
  _func_void_search_ptr_size_t_ptr_options_i_ptr *p_Var16;
  unsigned_long in_stack_ffffffffffffd8f8;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffd908;
  undefined7 in_stack_ffffffffffffd910;
  undefined1 in_stack_ffffffffffffd917;
  search *in_stack_ffffffffffffd958;
  vw *in_stack_ffffffffffffd960;
  search *in_stack_ffffffffffffd9a8;
  undefined6 in_stack_ffffffffffffd9b0;
  undefined1 in_stack_ffffffffffffd9b6;
  byte bVar17;
  undefined1 in_stack_ffffffffffffd9b7;
  float local_2550;
  float local_2548;
  action A;
  auto_condition_settings *acset;
  vw *all_00;
  allocator local_2231;
  string local_2230 [32];
  base_learner *local_2210;
  undefined1 local_2201;
  stringstream local_21e0 [16];
  ostream local_21d0;
  allocator local_2051;
  string local_2050 [39];
  allocator local_2029;
  string local_2028 [32];
  string local_2008 [39];
  allocator local_1fe1;
  string local_1fe0 [37];
  byte local_1fbb;
  byte local_1fba;
  allocator local_1fb9;
  string local_1fb8 [37];
  byte local_1f93;
  byte local_1f92;
  allocator local_1f91;
  string local_1f90 [37];
  byte local_1f6b;
  byte local_1f6a;
  allocator local_1f69;
  string local_1f68 [37];
  byte local_1f43;
  byte local_1f42;
  allocator local_1f41;
  string local_1f40 [39];
  allocator local_1f19;
  string local_1f18 [32];
  undefined **local_1ef8;
  undefined1 local_1ee9;
  stringstream local_1ec8 [16];
  ostream local_1eb8;
  allocator local_1d39;
  string local_1d38 [32];
  undefined **local_1d18;
  undefined **local_1d10;
  undefined **local_1d08;
  allocator local_1cf9;
  string local_1cf8 [32];
  string local_1cd8 [39];
  allocator local_1cb1;
  string local_1cb0 [39];
  allocator local_1c89;
  string local_1c88 [32];
  string local_1c68 [39];
  allocator local_1c41;
  string local_1c40 [36];
  uint32_t local_1c1c;
  label_t local_1c18;
  wclass *local_1c10;
  wclass *local_1c08;
  size_t local_1c00;
  label_t local_1bf8;
  wclass *pwStack_1bf0;
  wclass *local_1be8;
  size_t sStack_1be0;
  label_t local_1bd8;
  wclass *local_1bd0;
  wclass *local_1bc8;
  size_t local_1bc0;
  label_t local_1bb8;
  wclass *pwStack_1bb0;
  wclass *local_1ba8;
  size_t sStack_1ba0;
  allocator local_1b91;
  string local_1b90 [39];
  undefined1 local_1b69;
  stringstream local_1b48 [16];
  ostream local_1b38;
  undefined1 local_19b9;
  stringstream local_1998 [16];
  ostream local_1988;
  undefined1 local_1809;
  stringstream local_17e8 [16];
  ostream local_17d8;
  undefined4 local_1660;
  allocator local_1659;
  string local_1658 [39];
  allocator local_1631;
  string local_1630 [39];
  allocator local_1609;
  string local_1608 [199];
  allocator local_1541;
  string local_1540 [39];
  allocator local_1519;
  string local_1518 [199];
  allocator local_1451;
  string local_1450 [39];
  allocator local_1429;
  string local_1428 [199];
  allocator local_1361;
  string local_1360 [39];
  allocator local_1339;
  string local_1338 [199];
  allocator local_1271;
  string local_1270 [39];
  allocator local_1249;
  string local_1248 [199];
  allocator local_1181;
  string local_1180 [39];
  allocator local_1159;
  string local_1158 [199];
  allocator local_1091;
  string local_1090 [39];
  allocator local_1069;
  string local_1068 [32];
  typed_option<unsigned_long> local_1048;
  allocator local_fa1;
  string local_fa0 [39];
  allocator local_f79;
  string local_f78 [199];
  allocator local_eb1;
  string local_eb0 [39];
  allocator local_e89;
  string local_e88 [32];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e68;
  allocator local_dc1;
  string local_dc0 [39];
  allocator local_d99;
  string local_d98 [199];
  allocator local_cd1;
  string local_cd0 [39];
  allocator local_ca9;
  string local_ca8 [199];
  allocator local_be1;
  string local_be0 [39];
  allocator local_bb9;
  string local_bb8 [199];
  allocator local_af1;
  string local_af0 [39];
  allocator local_ac9;
  string local_ac8 [199];
  allocator local_a01;
  string local_a00 [39];
  allocator local_9d9;
  string local_9d8 [199];
  allocator local_911;
  string local_910 [39];
  allocator local_8e9;
  string local_8e8 [199];
  allocator local_821;
  string local_820 [39];
  allocator local_7f9;
  string local_7f8 [199];
  allocator local_731;
  string local_730 [39];
  allocator local_709;
  string local_708 [199];
  allocator local_641;
  string local_640 [39];
  allocator local_619;
  string local_618 [199];
  allocator local_551;
  string local_550 [39];
  allocator local_529;
  string local_528 [32];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_508;
  allocator local_461;
  string local_460 [39];
  allocator local_439;
  string local_438 [32];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_418;
  allocator local_371;
  string local_370 [39];
  allocator local_349;
  string local_348 [32];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_328;
  allocator local_281;
  string local_280 [39];
  allocator local_259;
  string local_258 [32];
  typed_option<unsigned_long> local_238;
  allocator local_191;
  string local_190 [32];
  undefined1 local_170 [56];
  string local_138 [39];
  allocator local_111;
  string local_110 [39];
  undefined1 local_e9 [33];
  string local_c8 [55];
  allocator local_91;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  search_private *local_30;
  undefined1 local_28 [32];
  vw *local_8;
  
  all_00 = (vw *)local_28;
  local_28._16_8_ = in_RSI._M_thread;
  local_28._24_8_ = in_RDI;
  scoped_calloc_or_throw<Search::search>();
  psVar8 = std::unique_ptr<Search::search,_void_(*)(void_*)>::operator->
                     ((unique_ptr<Search::search,_void_(*)(void_*)> *)0x137869);
  local_30 = psVar8->priv;
  std::__cxx11::string::string(local_50);
  std::__cxx11::string::string(local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"data",&local_91);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::string(local_c8);
  acset = (auto_condition_settings *)local_e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_e9 + 1),"mix_per_state",(allocator *)acset);
  std::allocator<char>::~allocator((allocator<char> *)local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"mix_per_state",&local_111);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  std::__cxx11::string::string(local_138);
  local_30->A = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"Search options",&local_191);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_ffffffffffffd8c0,in_stack_ffffffffffffd8b8);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"search",&local_259);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffd8c8,(unsigned_long *)in_stack_ffffffffffffd8c0);
  VW::config::typed_option<unsigned_long>::keep(&local_238,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_280,"Use learning to search, argument=maximum action id or 0 for LDF",&local_281)
  ;
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffd8c0,in_stack_ffffffffffffd8b8);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd917,in_stack_ffffffffffffd910),
             (typed_option<unsigned_long> *)in_stack_ffffffffffffd908);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffd8c0);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_348,"search_task",&local_349);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffd8c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd8c0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep(&local_328,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_370,
             "the search task (use \"--search_task list\" to get a list of available tasks)",
             &local_371);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_ffffffffffffd8c0,in_stack_ffffffffffffd8b8);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd917,in_stack_ffffffffffffd910),in_stack_ffffffffffffd908
            );
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_ffffffffffffd8c0);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_438,"search_metatask",&local_439);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffd8c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd8c0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep(&local_418,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_460,
             "the search metatask (use \"--search_metatask list\" to get a list of available metatasks)"
             ,&local_461);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_ffffffffffffd8c0,in_stack_ffffffffffffd8b8);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd917,in_stack_ffffffffffffd910),in_stack_ffffffffffffd908
            );
  std::__cxx11::string::~string(local_460);
  std::allocator<char>::~allocator((allocator<char> *)&local_461);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_ffffffffffffd8c0);
  std::__cxx11::string::~string(local_438);
  std::allocator<char>::~allocator((allocator<char> *)&local_439);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_528,"search_interpolation",&local_529);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffd8c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd8c0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep(&local_508,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_550,"at what level should interpolation happen? [*data|policy]",&local_551);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_ffffffffffffd8c0,in_stack_ffffffffffffd8b8);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd917,in_stack_ffffffffffffd910),in_stack_ffffffffffffd908
            );
  std::__cxx11::string::~string(local_550);
  std::allocator<char>::~allocator((allocator<char> *)&local_551);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_ffffffffffffd8c0);
  std::__cxx11::string::~string(local_528);
  std::allocator<char>::~allocator((allocator<char> *)&local_529);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_618,"search_rollout",&local_619);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffd8c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd8c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_640,
             "how should rollouts be executed?           [policy|oracle|*mix_per_state|mix_per_roll|none]"
             ,&local_641);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_ffffffffffffd8c0,in_stack_ffffffffffffd8b8);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd917,in_stack_ffffffffffffd910),in_stack_ffffffffffffd908
            );
  std::__cxx11::string::~string(local_640);
  std::allocator<char>::~allocator((allocator<char> *)&local_641);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_ffffffffffffd8c0);
  std::__cxx11::string::~string(local_618);
  std::allocator<char>::~allocator((allocator<char> *)&local_619);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_708,"search_rollin",&local_709);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffd8c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd8c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_730,
             "how should past trajectories be generated? [policy|oracle|*mix_per_state|mix_per_roll]"
             ,&local_731);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_ffffffffffffd8c0,in_stack_ffffffffffffd8b8);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd917,in_stack_ffffffffffffd910),in_stack_ffffffffffffd908
            );
  std::__cxx11::string::~string(local_730);
  std::allocator<char>::~allocator((allocator<char> *)&local_731);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_ffffffffffffd8c0);
  std::__cxx11::string::~string(local_708);
  std::allocator<char>::~allocator((allocator<char> *)&local_709);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7f8,"search_passes_per_policy",&local_7f9);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffd8c8,(unsigned_long *)in_stack_ffffffffffffd8c0);
  VW::config::typed_option<unsigned_long>::default_value
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffd8d0,
             (unsigned_long)in_stack_ffffffffffffd8c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_820,"number of passes per policy (only valid for search_interpolation=policy)",
             &local_821);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffd8c0,in_stack_ffffffffffffd8b8);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd917,in_stack_ffffffffffffd910),
             (typed_option<unsigned_long> *)in_stack_ffffffffffffd908);
  std::__cxx11::string::~string(local_820);
  std::allocator<char>::~allocator((allocator<char> *)&local_821);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffd8c0);
  std::__cxx11::string::~string(local_7f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8e8,"search_beta",&local_8e9);
  VW::config::make_option<float>(in_stack_ffffffffffffd8c8,(float *)in_stack_ffffffffffffd8c0);
  VW::config::typed_option<float>::default_value
            (in_stack_ffffffffffffd8d0,(float)((ulong)in_stack_ffffffffffffd8c8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_910,
             "interpolation rate for policies (only valid for search_interpolation=policy)",
             &local_911);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffd8c0,in_stack_ffffffffffffd8b8);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd917,in_stack_ffffffffffffd910),
             (typed_option<float> *)in_stack_ffffffffffffd908);
  std::__cxx11::string::~string(local_910);
  std::allocator<char>::~allocator((allocator<char> *)&local_911);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffd8c0);
  std::__cxx11::string::~string(local_8e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9d8,"search_alpha",&local_9d9);
  VW::config::make_option<float>(in_stack_ffffffffffffd8c8,(float *)in_stack_ffffffffffffd8c0);
  VW::config::typed_option<float>::default_value
            (in_stack_ffffffffffffd8d0,(float)((ulong)in_stack_ffffffffffffd8c8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a00,"annealed beta = 1-(1-alpha)^t (only valid for search_interpolation=data)",
             &local_a01);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffd8c0,in_stack_ffffffffffffd8b8);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd917,in_stack_ffffffffffffd910),
             (typed_option<float> *)in_stack_ffffffffffffd908);
  std::__cxx11::string::~string(local_a00);
  std::allocator<char>::~allocator((allocator<char> *)&local_a01);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffd8c0);
  std::__cxx11::string::~string(local_9d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ac8,"search_total_nb_policies",&local_ac9);
  VW::config::make_option<unsigned_int>(in_stack_ffffffffffffd8c8,(uint *)in_stack_ffffffffffffd8c0)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_af0,
             "if we are going to train the policies through multiple separate calls to vw, we need to specify this parameter and tell vw how many policies are eventually going to be trained"
             ,&local_af1);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffd8c0,in_stack_ffffffffffffd8b8);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd917,in_stack_ffffffffffffd910),
             (typed_option<unsigned_int> *)in_stack_ffffffffffffd908);
  std::__cxx11::string::~string(local_af0);
  std::allocator<char>::~allocator((allocator<char> *)&local_af1);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffd8c0);
  std::__cxx11::string::~string(local_ac8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ac9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bb8,"search_trained_nb_policies",&local_bb9);
  VW::config::make_option<unsigned_int>(in_stack_ffffffffffffd8c8,(uint *)in_stack_ffffffffffffd8c0)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_be0,"the number of trained policies in a file",&local_be1);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffd8c0,in_stack_ffffffffffffd8b8);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd917,in_stack_ffffffffffffd910),
             (typed_option<unsigned_int> *)in_stack_ffffffffffffd908);
  std::__cxx11::string::~string(local_be0);
  std::allocator<char>::~allocator((allocator<char> *)&local_be1);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffd8c0);
  std::__cxx11::string::~string(local_bb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_bb9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ca8,"search_allowed_transitions",&local_ca9);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffd8c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd8c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_cd0,"read file of allowed transitions [def: all transitions are allowed]",
             &local_cd1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_ffffffffffffd8c0,in_stack_ffffffffffffd8b8);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd917,in_stack_ffffffffffffd910),in_stack_ffffffffffffd908
            );
  std::__cxx11::string::~string(local_cd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_cd1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_ffffffffffffd8c0);
  std::__cxx11::string::~string(local_ca8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ca9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d98,"search_subsample_time",&local_d99);
  VW::config::make_option<float>(in_stack_ffffffffffffd8c8,(float *)in_stack_ffffffffffffd8c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_dc0,
             "instead of training at all timesteps, use a subset. if value in (0,1), train on a random v%. if v>=1, train on precisely v steps per example, if v<=-1, use active learning"
             ,&local_dc1);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffd8c0,in_stack_ffffffffffffd8b8);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd917,in_stack_ffffffffffffd910),
             (typed_option<float> *)in_stack_ffffffffffffd908);
  std::__cxx11::string::~string(local_dc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_dc1);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffd8c0);
  std::__cxx11::string::~string(local_d98);
  std::allocator<char>::~allocator((allocator<char> *)&local_d99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e88,"search_neighbor_features",&local_e89);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffd8c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd8c0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep(&local_e68,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_eb0,
             "copy features from neighboring lines. argument looks like: \'-1:a,+2\' meaning copy previous line namespace a and next next line from namespace _unnamed_, where \',\' separates them"
             ,&local_eb1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_ffffffffffffd8c0,in_stack_ffffffffffffd8b8);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd917,in_stack_ffffffffffffd910),in_stack_ffffffffffffd908
            );
  std::__cxx11::string::~string(local_eb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_eb1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_ffffffffffffd8c0);
  std::__cxx11::string::~string(local_e88);
  std::allocator<char>::~allocator((allocator<char> *)&local_e89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f78,"search_rollout_num_steps",&local_f79);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffd8c8,(unsigned_long *)in_stack_ffffffffffffd8c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_fa0,
             "how many calls of \"loss\" before we stop really predicting on rollouts and switch to oracle (default means \"infinite\")"
             ,&local_fa1);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffd8c0,in_stack_ffffffffffffd8b8);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd917,in_stack_ffffffffffffd910),
             (typed_option<unsigned_long> *)in_stack_ffffffffffffd908);
  std::__cxx11::string::~string(local_fa0);
  std::allocator<char>::~allocator((allocator<char> *)&local_fa1);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffd8c0);
  std::__cxx11::string::~string(local_f78);
  std::allocator<char>::~allocator((allocator<char> *)&local_f79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1068,"search_history_length",&local_1069);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffd8c8,(unsigned_long *)in_stack_ffffffffffffd8c0);
  VW::config::typed_option<unsigned_long>::keep(&local_1048,true);
  VW::config::typed_option<unsigned_long>::default_value
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffd8d0,
             (unsigned_long)in_stack_ffffffffffffd8c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1090,
             "some tasks allow you to specify how much history their depend on; specify that here",
             &local_1091);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffd8c0,in_stack_ffffffffffffd8b8);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd917,in_stack_ffffffffffffd910),
             (typed_option<unsigned_long> *)in_stack_ffffffffffffd908);
  std::__cxx11::string::~string(local_1090);
  std::allocator<char>::~allocator((allocator<char> *)&local_1091);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffd8c0);
  std::__cxx11::string::~string(local_1068);
  std::allocator<char>::~allocator((allocator<char> *)&local_1069);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1158,"search_no_caching",&local_1159);
  VW::config::make_option<bool>(in_stack_ffffffffffffd8c8,(bool *)in_stack_ffffffffffffd8c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1180,
             "turn off the built-in caching ability (makes things slower, but technically more safe)"
             ,&local_1181);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffd8c0,in_stack_ffffffffffffd8b8);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd917,in_stack_ffffffffffffd910),
             (typed_option<bool> *)in_stack_ffffffffffffd908);
  std::__cxx11::string::~string(local_1180);
  std::allocator<char>::~allocator((allocator<char> *)&local_1181);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffd8c0);
  std::__cxx11::string::~string(local_1158);
  std::allocator<char>::~allocator((allocator<char> *)&local_1159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1248,"search_xv",&local_1249);
  VW::config::make_option<bool>(in_stack_ffffffffffffd8c8,(bool *)in_stack_ffffffffffffd8c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1270,"train two separate policies, alternating prediction/learning",&local_1271);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffd8c0,in_stack_ffffffffffffd8b8);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd917,in_stack_ffffffffffffd910),
             (typed_option<bool> *)in_stack_ffffffffffffd908);
  std::__cxx11::string::~string(local_1270);
  std::allocator<char>::~allocator((allocator<char> *)&local_1271);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffd8c0);
  std::__cxx11::string::~string(local_1248);
  std::allocator<char>::~allocator((allocator<char> *)&local_1249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1338,"search_perturb_oracle",&local_1339);
  VW::config::make_option<float>(in_stack_ffffffffffffd8c8,(float *)in_stack_ffffffffffffd8c0);
  VW::config::typed_option<float>::default_value
            (in_stack_ffffffffffffd8d0,(float)((ulong)in_stack_ffffffffffffd8c8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1360,"perturb the oracle on rollin with this probability",&local_1361);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffd8c0,in_stack_ffffffffffffd8b8);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd917,in_stack_ffffffffffffd910),
             (typed_option<float> *)in_stack_ffffffffffffd908);
  std::__cxx11::string::~string(local_1360);
  std::allocator<char>::~allocator((allocator<char> *)&local_1361);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffd8c0);
  std::__cxx11::string::~string(local_1338);
  std::allocator<char>::~allocator((allocator<char> *)&local_1339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1428,"search_linear_ordering",&local_1429);
  VW::config::make_option<bool>(in_stack_ffffffffffffd8c8,(bool *)in_stack_ffffffffffffd8c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1450,"insist on generating examples in linear order (def: hoopla permutation)",
             &local_1451);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffd8c0,in_stack_ffffffffffffd8b8);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd917,in_stack_ffffffffffffd910),
             (typed_option<bool> *)in_stack_ffffffffffffd908);
  std::__cxx11::string::~string(local_1450);
  std::allocator<char>::~allocator((allocator<char> *)&local_1451);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffd8c0);
  std::__cxx11::string::~string(local_1428);
  std::allocator<char>::~allocator((allocator<char> *)&local_1429);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1518,"search_active_verify",&local_1519);
  VW::config::make_option<float>(in_stack_ffffffffffffd8c8,(float *)in_stack_ffffffffffffd8c0);
  paVar15 = &local_1541;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1540,
             "verify that active learning is doing the right thing (arg = multiplier, should be = cost_range * range_c)"
             ,paVar15);
  filename = VW::config::typed_option<float>::help
                       ((typed_option<float> *)in_stack_ffffffffffffd8c0,in_stack_ffffffffffffd8b8);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd917,in_stack_ffffffffffffd910),
             (typed_option<float> *)in_stack_ffffffffffffd908);
  std::__cxx11::string::~string(local_1540);
  std::allocator<char>::~allocator((allocator<char> *)&local_1541);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffd8c0);
  std::__cxx11::string::~string(local_1518);
  std::allocator<char>::~allocator((allocator<char> *)&local_1519);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1608,"search_save_every_k_runs",&local_1609);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffd8c8,(unsigned_long *)in_stack_ffffffffffffd8c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1630,"save model every k runs",&local_1631);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffd8c0,in_stack_ffffffffffffd8b8);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd917,in_stack_ffffffffffffd910),
             (typed_option<unsigned_long> *)in_stack_ffffffffffffd908);
  std::__cxx11::string::~string(local_1630);
  std::allocator<char>::~allocator((allocator<char> *)&local_1631);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffd8c0);
  std::__cxx11::string::~string(local_1608);
  std::allocator<char>::~allocator((allocator<char> *)&local_1609);
  (*(code *)**(undefined8 **)local_28._24_8_)(local_28._24_8_,local_170);
  uVar11 = local_28._24_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1658,"search_task",&local_1659);
  bVar4 = (**(code **)(*(long *)uVar11 + 8))(uVar11,local_1658);
  std::__cxx11::string::~string(local_1658);
  std::allocator<char>::~allocator((allocator<char> *)&local_1659);
  if (((bVar4 ^ 0xff) & 1) == 0) {
    std::unique_ptr<Search::search,_void_(*)(void_*)>::get
              ((unique_ptr<Search::search,_void_(*)(void_*)> *)in_stack_ffffffffffffd8c0);
    search_initialize(in_stack_ffffffffffffd960,in_stack_ffffffffffffd958);
    std::unique_ptr<Search::search,_void_(*)(void_*)>::get
              ((unique_ptr<Search::search,_void_(*)(void_*)> *)in_stack_ffffffffffffd8c0);
    parse_neighbor_features
              ((string *)
               CONCAT17(in_stack_ffffffffffffd9b7,
                        CONCAT16(in_stack_ffffffffffffd9b6,in_stack_ffffffffffffd9b0)),
               in_stack_ffffffffffffd9a8);
    iVar6 = std::__cxx11::string::compare((char *)local_90);
    if (iVar6 == 0) {
      local_30->adaptive_beta = true;
      local_30->allow_current_policy = true;
      local_30->passes_per_policy = *(size_t *)(local_28._16_8_ + 0x348);
      if (1 < local_30->current_policy) {
        local_30->current_policy = 1;
      }
    }
    else {
      iVar6 = std::__cxx11::string::compare((char *)local_90);
      iVar7 = (int)((ulong)in_stack_ffffffffffffd8e0 >> 0x20);
      if (iVar6 != 0) {
        std::__cxx11::stringstream::stringstream(local_17e8);
        std::operator<<(&local_17d8,"error: --search_interpolation must be \'data\' or \'policy\'");
        local_1809 = 1;
        uVar11 = __cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        VW::vw_exception::vw_exception
                  (in_stack_ffffffffffffd8f0,(char *)in_stack_ffffffffffffd8e8,iVar7,
                   (string *)CONCAT44(in_stack_ffffffffffffd8dc,in_stack_ffffffffffffd8d8));
        local_1809 = 0;
        __cxa_throw(uVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
    }
    iVar6 = std::__cxx11::string::compare(local_e9 + 1);
    if ((iVar6 == 0) || (iVar6 = std::__cxx11::string::compare(local_e9 + 1), iVar6 == 0)) {
      local_30->rollout_method = POLICY;
    }
    else {
      iVar6 = std::__cxx11::string::compare(local_e9 + 1);
      if ((iVar6 == 0) || (iVar6 = std::__cxx11::string::compare(local_e9 + 1), iVar6 == 0)) {
        local_30->rollout_method = ORACLE;
      }
      else {
        iVar6 = std::__cxx11::string::compare(local_e9 + 1);
        if (iVar6 == 0) {
          local_30->rollout_method = MIX_PER_STATE;
        }
        else {
          iVar6 = std::__cxx11::string::compare(local_e9 + 1);
          if ((iVar6 == 0) || (iVar6 = std::__cxx11::string::compare(local_e9 + 1), iVar6 == 0)) {
            local_30->rollout_method = MIX_PER_ROLL;
          }
          else {
            iVar6 = std::__cxx11::string::compare(local_e9 + 1);
            iVar7 = (int)((ulong)in_stack_ffffffffffffd8e0 >> 0x20);
            if (iVar6 != 0) {
              std::__cxx11::stringstream::stringstream(local_1998);
              std::operator<<(&local_1988,
                              "error: --search_rollout must be \'learn\', \'ref\', \'mix\', \'mix_per_state\' or \'none\'"
                             );
              local_19b9 = 1;
              uVar11 = __cxa_allocate_exception(0x38);
              std::__cxx11::stringstream::str();
              VW::vw_exception::vw_exception
                        (in_stack_ffffffffffffd8f0,(char *)in_stack_ffffffffffffd8e8,iVar7,
                         (string *)CONCAT44(in_stack_ffffffffffffd8dc,in_stack_ffffffffffffd8d8));
              local_19b9 = 0;
              __cxa_throw(uVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
            }
            local_30->rollout_method = NO_ROLLOUT;
            local_30->no_caching = true;
          }
        }
      }
    }
    iVar6 = std::__cxx11::string::compare((char *)local_110);
    if ((iVar6 == 0) || (iVar6 = std::__cxx11::string::compare((char *)local_110), iVar6 == 0)) {
      local_30->rollin_method = POLICY;
    }
    else {
      iVar6 = std::__cxx11::string::compare((char *)local_110);
      if ((iVar6 == 0) || (iVar6 = std::__cxx11::string::compare((char *)local_110), iVar6 == 0)) {
        local_30->rollin_method = ORACLE;
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)local_110);
        if (iVar6 == 0) {
          local_30->rollin_method = MIX_PER_STATE;
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)local_110);
          if (iVar6 != 0) {
            iVar6 = std::__cxx11::string::compare((char *)local_110);
            iVar7 = (int)((ulong)in_stack_ffffffffffffd8e0 >> 0x20);
            if (iVar6 != 0) {
              std::__cxx11::stringstream::stringstream(local_1b48);
              std::operator<<(&local_1b38,
                              "error: --search_rollin must be \'learn\', \'ref\', \'mix\' or \'mix_per_state\'"
                             );
              local_1b69 = 1;
              uVar11 = __cxa_allocate_exception(0x38);
              std::__cxx11::stringstream::str();
              VW::vw_exception::vw_exception
                        (in_stack_ffffffffffffd8f0,(char *)in_stack_ffffffffffffd8e8,iVar7,
                         (string *)CONCAT44(in_stack_ffffffffffffd8dc,in_stack_ffffffffffffd8d8));
              local_1b69 = 0;
              __cxa_throw(uVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
            }
          }
          local_30->rollin_method = MIX_PER_ROLL;
        }
      }
    }
    ppVar9 = calloc_or_throw<polylabel>();
    uVar11 = local_28._24_8_;
    local_30->allowed_actions_cache = ppVar9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b90,"cb",&local_1b91);
    bVar4 = (**(code **)(*(long *)uVar11 + 8))(uVar11,local_1b90);
    std::__cxx11::string::~string(local_1b90);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b91);
    if ((bVar4 & 1) == 0) {
      local_30->cb_learner = false;
      (*(code *)COST_SENSITIVE::cs_label)(local_30->allowed_actions_cache);
      v_init<COST_SENSITIVE::wclass>();
      (local_30->learn_losses).cs.costs.end_array = local_1be8;
      (local_30->learn_losses).cs.costs.erase_count = sStack_1be0;
      (local_30->learn_losses).multi = local_1bf8;
      (local_30->learn_losses).cs.costs._end = pwStack_1bf0;
      v_init<COST_SENSITIVE::wclass>();
      (local_30->gte_label).multi = local_1c18;
      (local_30->gte_label).cs.costs._end = local_1c10;
      (local_30->gte_label).cs.costs.end_array = local_1c08;
      (local_30->gte_label).cs.costs.erase_count = local_1c00;
    }
    else {
      local_30->cb_learner = true;
      (*(code *)CB::cb_label)(local_30->allowed_actions_cache);
      v_init<CB::cb_class>();
      (local_30->learn_losses).cs.costs.end_array = local_1ba8;
      (local_30->learn_losses).cs.costs.erase_count = sStack_1ba0;
      (local_30->learn_losses).multi = local_1bb8;
      (local_30->learn_losses).cs.costs._end = pwStack_1bb0;
      v_init<CB::cb_class>();
      (local_30->gte_label).multi = local_1bd8;
      (local_30->gte_label).cs.costs._end = local_1bd0;
      (local_30->gte_label).cs.costs.end_array = local_1bc8;
      (local_30->gte_label).cs.costs.erase_count = local_1bc0;
    }
    ensure_param((float *)in_stack_ffffffffffffd8d0,
                 (float)((ulong)in_stack_ffffffffffffd8c8 >> 0x20),
                 SUB84(in_stack_ffffffffffffd8c8,0),
                 (float)((ulong)in_stack_ffffffffffffd8c0 >> 0x20),(char *)in_stack_ffffffffffffd8b8
                );
    ensure_param((float *)in_stack_ffffffffffffd8d0,
                 (float)((ulong)in_stack_ffffffffffffd8c8 >> 0x20),
                 SUB84(in_stack_ffffffffffffd8c8,0),
                 (float)((ulong)in_stack_ffffffffffffd8c0 >> 0x20),(char *)in_stack_ffffffffffffd8b8
                );
    local_30->num_calls_to_run = 0;
    local_1c1c = local_30->current_policy;
    if ((*(byte *)(local_28._16_8_ + 0x343a) & 1) != 0) {
      local_2548 = (float)*(ulong *)(local_28._16_8_ + 0x348);
      local_2550 = (float)local_30->passes_per_policy;
      dVar3 = std::ceil((double)(ulong)(uint)(local_2548 / local_2550));
      local_1c1c = (int)SUB84(dVar3,0) + local_1c1c;
    }
    if ((local_30->total_number_of_policies < local_1c1c) &&
       (local_30->total_number_of_policies = local_1c1c, local_30->current_policy != 0)) {
      poVar10 = std::operator<<((ostream *)&std::cerr,
                                "warning: you\'re attempting to train more classifiers than was allocated initially. Likely to cause bad performance."
                               );
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    }
    if (((*(byte *)(local_28._16_8_ + 0x343a) & 1) == 0) && (local_30->current_policy != 0)) {
      local_30->current_policy = local_30->current_policy - 1;
    }
    plVar1 = *(long **)(local_28._16_8_ + 0x278);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c40,"search_trained_nb_policies",&local_1c41);
    std::__cxx11::to_string((uint)((ulong)in_stack_ffffffffffffd8e8 >> 0x20));
    (**(code **)(*plVar1 + 0x30))(plVar1,local_1c40,local_1c68);
    std::__cxx11::string::~string(local_1c68);
    std::__cxx11::string::~string(local_1c40);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c88,"search_trained_nb_policies",&local_1c89);
    VW::config::options_i::get_typed_option<unsigned_int>
              ((options_i *)in_stack_ffffffffffffd8f0,in_stack_ffffffffffffd8e8);
    VW::config::typed_option<unsigned_int>::value
              ((typed_option<unsigned_int> *)in_stack_ffffffffffffd8d0,
               (uint)((ulong)in_stack_ffffffffffffd8c8 >> 0x20));
    std::__cxx11::string::~string(local_1c88);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c89);
    plVar1 = *(long **)(local_28._16_8_ + 0x278);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1cb0,"search_total_nb_policies",&local_1cb1);
    std::__cxx11::to_string((uint)((ulong)in_stack_ffffffffffffd8e8 >> 0x20));
    (**(code **)(*plVar1 + 0x30))(plVar1,local_1cb0,local_1cd8);
    std::__cxx11::string::~string(local_1cd8);
    std::__cxx11::string::~string(local_1cb0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1cb1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1cf8,"search_total_nb_policies",&local_1cf9);
    VW::config::options_i::get_typed_option<unsigned_int>
              ((options_i *)in_stack_ffffffffffffd8f0,in_stack_ffffffffffffd8e8);
    VW::config::typed_option<unsigned_int>::value
              ((typed_option<unsigned_int> *)in_stack_ffffffffffffd8d0,
               (uint)((ulong)in_stack_ffffffffffffd8c8 >> 0x20));
    std::__cxx11::string::~string(local_1cf8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1cf9);
    iVar6 = std::__cxx11::string::compare((char *)local_50);
    if (iVar6 == 0) {
      poVar10 = (ostream *)
                std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
      poVar10 = std::operator<<(poVar10,"available search tasks:");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      for (local_1d08 = &all_tasks; *local_1d08 != (undefined *)0x0; local_1d08 = local_1d08 + 1) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"  ");
        poVar10 = std::operator<<(poVar10,*(char **)*local_1d08);
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      }
      std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
      exit(0);
    }
    iVar6 = std::__cxx11::string::compare((char *)local_70);
    if (iVar6 == 0) {
      poVar10 = (ostream *)
                std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
      poVar10 = std::operator<<(poVar10,"available search metatasks:");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      for (local_1d10 = &all_metatasks; *local_1d10 != (undefined *)0x0; local_1d10 = local_1d10 + 1
          ) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"  ");
        poVar10 = std::operator<<(poVar10,*(char **)*local_1d10);
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      }
      std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
      exit(0);
    }
    for (local_1d18 = &all_tasks; *local_1d18 != (undefined *)0x0; local_1d18 = local_1d18 + 1) {
      iVar6 = std::__cxx11::string::compare((char *)local_50);
      if (iVar6 == 0) {
        local_30->task = (search_task *)*local_1d18;
        pcVar2 = *(char **)*local_1d18;
        psVar8 = std::unique_ptr<Search::search,_void_(*)(void_*)>::operator->
                           ((unique_ptr<Search::search,_void_(*)(void_*)> *)0x13b36b);
        psVar8->task_name = pcVar2;
        break;
      }
    }
    uVar11 = local_28._24_8_;
    if (local_30->task == (search_task *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d38,"help",&local_1d39);
      bVar4 = (**(code **)(*(long *)uVar11 + 8))(uVar11,local_1d38);
      std::__cxx11::string::~string(local_1d38);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d39);
      iVar6 = (int)((ulong)in_stack_ffffffffffffd8e0 >> 0x20);
      if (((bVar4 ^ 0xff) & 1) != 0) {
        std::__cxx11::stringstream::stringstream(local_1ec8);
        poVar10 = std::operator<<(&local_1eb8,"fail: unknown task for --search_task \'");
        poVar10 = std::operator<<(poVar10,local_50);
        std::operator<<(poVar10,"\'; use --search_task list to get a list");
        local_1ee9 = 1;
        uVar11 = __cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        VW::vw_exception::vw_exception
                  (in_stack_ffffffffffffd8f0,(char *)in_stack_ffffffffffffd8e8,iVar6,
                   (string *)CONCAT44(in_stack_ffffffffffffd8dc,in_stack_ffffffffffffd8d8));
        local_1ee9 = 0;
        __cxa_throw(uVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
    }
    local_30->metatask = (search_metatask *)0x0;
    local_1ef8 = &all_metatasks;
    while( true ) {
      A = (action)((ulong)paVar15 >> 0x20);
      iVar6 = (int)((ulong)in_stack_ffffffffffffd8e0 >> 0x20);
      if (*local_1ef8 == (undefined *)0x0) break;
      iVar7 = std::__cxx11::string::compare((char *)local_70);
      A = (action)((ulong)paVar15 >> 0x20);
      iVar6 = (int)((ulong)in_stack_ffffffffffffd8e0 >> 0x20);
      if (iVar7 == 0) {
        local_30->metatask = (search_metatask *)*local_1ef8;
        pcVar2 = *(char **)*local_1ef8;
        psVar8 = std::unique_ptr<Search::search,_void_(*)(void_*)>::operator->
                           ((unique_ptr<Search::search,_void_(*)(void_*)> *)0x13b67d);
        psVar8->metatask_name = pcVar2;
        break;
      }
      local_1ef8 = local_1ef8 + 1;
    }
    uVar11 = local_28._24_8_;
    *(undefined1 *)(*(long *)(local_28._16_8_ + 8) + 0x23c) = 1;
    std::allocator<char>::allocator();
    local_1f42 = 0;
    local_1f43 = 0;
    local_1f6a = 0;
    local_1f6b = 0;
    local_1f92 = 0;
    local_1f93 = 0;
    local_1fba = 0;
    local_1fbb = 0;
    std::__cxx11::string::string(local_1f18,"csoaa",&local_1f19);
    bVar4 = (**(code **)(*(long *)uVar11 + 8))(uVar11,local_1f18);
    uVar11 = local_28._24_8_;
    bVar17 = 0;
    if ((bVar4 & 1) == 0) {
      paVar15 = &local_1f41;
      std::allocator<char>::allocator();
      local_1f42 = 1;
      std::__cxx11::string::string(local_1f40,"cs_active",paVar15);
      local_1f43 = 1;
      bVar4 = (**(code **)(*(long *)uVar11 + 8))(uVar11,local_1f40);
      uVar11 = local_28._24_8_;
      bVar17 = 0;
      if ((bVar4 & 1) == 0) {
        std::allocator<char>::allocator();
        local_1f6a = 1;
        std::__cxx11::string::string(local_1f68,"csoaa_ldf",&local_1f69);
        local_1f6b = 1;
        bVar4 = (**(code **)(*(long *)uVar11 + 8))(uVar11,local_1f68);
        uVar11 = local_28._24_8_;
        bVar17 = 0;
        if ((bVar4 & 1) == 0) {
          std::allocator<char>::allocator();
          local_1f92 = 1;
          std::__cxx11::string::string(local_1f90,"wap_ldf",&local_1f91);
          local_1f93 = 1;
          bVar4 = (**(code **)(*(long *)uVar11 + 8))(uVar11,local_1f90);
          bVar17 = 0;
          if ((bVar4 & 1) == 0) {
            paVar15 = &local_1fb9;
            plVar14 = (learner<Search::search,_std::vector<example_*,_std::allocator<example_*>_>_>
                       *)local_28._24_8_;
            std::allocator<char>::allocator();
            local_1fba = 1;
            std::__cxx11::string::string(local_1fb8,"cb",paVar15);
            local_1fbb = 1;
            bVar17 = (**(code **)(*(long *)plVar14 + 8))(plVar14,local_1fb8);
            bVar17 = bVar17 ^ 0xff;
          }
        }
      }
    }
    if ((local_1fbb & 1) != 0) {
      std::__cxx11::string::~string(local_1fb8);
    }
    if ((local_1fba & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_1fb9);
    }
    if ((local_1f93 & 1) != 0) {
      std::__cxx11::string::~string(local_1f90);
    }
    if ((local_1f92 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_1f91);
    }
    if ((local_1f6b & 1) != 0) {
      std::__cxx11::string::~string(local_1f68);
    }
    if ((local_1f6a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_1f69);
    }
    if ((local_1f43 & 1) != 0) {
      std::__cxx11::string::~string(local_1f40);
    }
    if ((local_1f42 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_1f41);
    }
    std::__cxx11::string::~string(local_1f18);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f19);
    uVar11 = local_28._24_8_;
    if ((bVar17 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1fe0,"csoaa",&local_1fe1);
      std::__cxx11::to_string(in_stack_ffffffffffffd8f8);
      (**(code **)(*(long *)uVar11 + 0x28))(uVar11,local_1fe0,local_2008);
      std::__cxx11::string::~string(local_2008);
      std::__cxx11::string::~string(local_1fe0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1fe1);
    }
    uVar11 = local_28._24_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2028,"cs_active",&local_2029);
    bVar4 = (**(code **)(*(long *)uVar11 + 8))(uVar11,local_2028);
    local_30->active_csoaa = (bool)(bVar4 & 1);
    std::__cxx11::string::~string(local_2028);
    std::allocator<char>::~allocator((allocator<char> *)&local_2029);
    uVar11 = local_28._24_8_;
    local_30->active_csoaa_verify = -1.0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2050,"search_active_verify",&local_2051);
    bVar4 = (**(code **)(*(long *)uVar11 + 8))(uVar11,local_2050);
    std::__cxx11::string::~string(local_2050);
    std::allocator<char>::~allocator((allocator<char> *)&local_2051);
    if (((bVar4 & 1) != 0) && ((local_30->active_csoaa & 1U) == 0)) {
      std::__cxx11::stringstream::stringstream(local_21e0);
      std::operator<<(&local_21d0,"cannot use --search_active_verify without using --cs_active");
      local_2201 = 1;
      uVar11 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_ffffffffffffd8f0,(char *)in_stack_ffffffffffffd8e8,iVar6,
                 (string *)CONCAT44(in_stack_ffffffffffffd8dc,in_stack_ffffffffffffd8d8));
      local_2201 = 0;
      __cxa_throw(uVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    local_2210 = setup_base((options_i *)in_stack_ffffffffffffd8c8,in_stack_ffffffffffffd8c0);
    memcpy((void *)(*(long *)(local_28._16_8_ + 8) + 0x338),MULTICLASS::mc_label,0x48);
    *(undefined4 *)(local_28._16_8_ + 0x3650) = 5;
    if ((local_30->task != (search_task *)0x0) &&
       (local_30->task->initialize != (_func_void_search_ptr_size_t_ptr_options_i_ptr *)0x0)) {
      p_Var16 = local_30->task->initialize;
      psVar8 = std::unique_ptr<Search::search,_void_(*)(void_*)>::get
                         ((unique_ptr<Search::search,_void_(*)(void_*)> *)in_stack_ffffffffffffd8c0)
      ;
      (*p_Var16)(psVar8,&local_30->A,(options_i *)local_28._24_8_);
    }
    if ((local_30->metatask != (search_metatask *)0x0) &&
       (local_30->metatask->initialize != (_func_void_search_ptr_size_t_ptr_options_i_ptr *)0x0)) {
      p_Var16 = local_30->metatask->initialize;
      psVar8 = std::unique_ptr<Search::search,_void_(*)(void_*)>::get
                         ((unique_ptr<Search::search,_void_(*)(void_*)> *)in_stack_ffffffffffffd8c0)
      ;
      (*p_Var16)(psVar8,&local_30->A,(options_i *)local_28._24_8_);
    }
    local_30->meta_t = 0;
    paVar15 = &local_2231;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2230,"search_allowed_transitions",paVar15);
    uVar5 = (**(code **)(*(long *)local_28._24_8_ + 8))(local_28._24_8_,local_2230);
    uVar13 = CONCAT13(uVar5,(int3)in_stack_ffffffffffffd8dc);
    std::__cxx11::string::~string(local_2230);
    std::allocator<char>::~allocator((allocator<char> *)&local_2231);
    plVar14 = (learner<Search::search,_std::vector<example_*,_std::allocator<example_*>_>_> *)
              local_28._24_8_;
    if ((uVar13 & 0x1000000) != 0) {
      in_stack_ffffffffffffd8d8 = (undefined4)local_30->A;
      std::__cxx11::string::c_str();
      read_allowed_transitions(A,(char *)filename);
      plVar14 = (learner<Search::search,_std::vector<example_*,_std::allocator<example_*>_>_> *)
                local_28._24_8_;
    }
    handle_condition_options(all_00,acset);
    if ((local_30->allow_current_policy & 1U) == 0) {
      *(size_t *)(local_28._16_8_ + 0x3468) = local_30->passes_per_policy;
    }
    psVar8 = std::unique_ptr<Search::search,_void_(*)(void_*)>::get
                       ((unique_ptr<Search::search,_void_(*)(void_*)> *)in_stack_ffffffffffffd8c0);
    *(pointer *)(local_28._16_8_ + 0x280) = psVar8;
    cVar12 = clock();
    local_30->start_clock_time = cVar12;
    if ((local_30->xv & 1U) != 0) {
      local_30->num_learners = local_30->num_learners * 3;
    }
    in_stack_ffffffffffffd8d0 = (typed_option<float> *)LEARNER::make_base<char,char>(local_2210);
    this = LEARNER::
           init_learner<Search::search,std::vector<example*,std::allocator<example*>>,LEARNER::learner<char,char>>
                     ((free_ptr<Search::search> *)plVar14,
                      (learner<char,_char> *)CONCAT44(uVar13,in_stack_ffffffffffffd8d8),
                      (_func_void_search_ptr_learner<char,_char>_ptr_vector<example_ptr,_std::allocator<example_ptr>_>_ptr
                       *)in_stack_ffffffffffffd8d0,
                      (_func_void_search_ptr_learner<char,_char>_ptr_vector<example_ptr,_std::allocator<example_ptr>_>_ptr
                       *)in_stack_ffffffffffffd8c8,(size_t)in_stack_ffffffffffffd8c0);
    LEARNER::learner<Search::search,_std::vector<example_*,_std::allocator<example_*>_>_>::
    set_finish_example(this,finish_multiline_example);
    LEARNER::learner<Search::search,_std::vector<example_*,_std::allocator<example_*>_>_>::
    set_end_examples(plVar14,(_func_void_search_ptr *)CONCAT44(uVar13,in_stack_ffffffffffffd8d8));
    LEARNER::learner<Search::search,_std::vector<example_*,_std::allocator<example_*>_>_>::
    set_finish(plVar14,(_func_void_search_ptr *)CONCAT44(uVar13,in_stack_ffffffffffffd8d8));
    LEARNER::learner<Search::search,_std::vector<example_*,_std::allocator<example_*>_>_>::
    set_end_pass(plVar14,(_func_void_search_ptr *)CONCAT44(uVar13,in_stack_ffffffffffffd8d8));
    in_stack_ffffffffffffd8c0 =
         (vw *)LEARNER::make_base<Search::search,std::vector<example*,std::allocator<example*>>>
                         (this);
    local_8 = in_stack_ffffffffffffd8c0;
  }
  else {
    local_8 = (vw *)0x0;
  }
  local_1660 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_ffffffffffffd8c0);
  std::__cxx11::string::~string(local_138);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string((string *)(local_e9 + 1));
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  std::unique_ptr<Search::search,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<Search::search,_void_(*)(void_*)> *)in_stack_ffffffffffffd8d0);
  return (base_learner *)local_8;
}

Assistant:

base_learner* setup(options_i& options, vw& all)
{
  free_ptr<search> sch = scoped_calloc_or_throw<search>();
  search_private& priv = *sch->priv;
  std::string task_string;
  std::string metatask_string;
  std::string interpolation_string = "data";
  std::string neighbor_features_string;
  std::string rollout_string = "mix_per_state";
  std::string rollin_string = "mix_per_state";

  uint32_t search_trained_nb_policies;
  std::string search_allowed_transitions;

  priv.A = 1;
  option_group_definition new_options("Search options");
  new_options.add(
      make_option("search", priv.A).keep().help("Use learning to search, argument=maximum action id or 0 for LDF"));
  new_options.add(make_option("search_task", task_string)
                      .keep()
                      .help("the search task (use \"--search_task list\" to get a list of available tasks)"));
  new_options.add(
      make_option("search_metatask", metatask_string)
          .keep()
          .help("the search metatask (use \"--search_metatask list\" to get a list of available metatasks)"));
  new_options.add(make_option("search_interpolation", interpolation_string)
                      .keep()
                      .help("at what level should interpolation happen? [*data|policy]"));
  new_options.add(
      make_option("search_rollout", rollout_string)
          .help("how should rollouts be executed?           [policy|oracle|*mix_per_state|mix_per_roll|none]"));
  new_options.add(make_option("search_rollin", rollin_string)
                      .help("how should past trajectories be generated? [policy|oracle|*mix_per_state|mix_per_roll]"));
  new_options.add(make_option("search_passes_per_policy", priv.passes_per_policy)
                      .default_value(1)
                      .help("number of passes per policy (only valid for search_interpolation=policy)"));
  new_options.add(make_option("search_beta", priv.beta)
                      .default_value(0.5f)
                      .help("interpolation rate for policies (only valid for search_interpolation=policy)"));
  new_options.add(make_option("search_alpha", priv.alpha)
                      .default_value(1e-10f)
                      .help("annealed beta = 1-(1-alpha)^t (only valid for search_interpolation=data)"));
  new_options.add(make_option("search_total_nb_policies", priv.total_number_of_policies)
                      .help("if we are going to train the policies through multiple separate calls to vw, we need to "
                            "specify this parameter and tell vw how many policies are eventually going to be trained"));
  new_options.add(make_option("search_trained_nb_policies", search_trained_nb_policies)
                      .help("the number of trained policies in a file"));
  new_options.add(make_option("search_allowed_transitions", search_allowed_transitions)
                      .help("read file of allowed transitions [def: all transitions are allowed]"));
  new_options.add(make_option("search_subsample_time", priv.subsample_timesteps)
                      .help("instead of training at all timesteps, use a subset. if value in (0,1), train on a random "
                            "v%. if v>=1, train on precisely v steps per example, if v<=-1, use active learning"));
  new_options.add(
      make_option("search_neighbor_features", neighbor_features_string)
          .keep()
          .help("copy features from neighboring lines. argument looks like: '-1:a,+2' meaning copy previous line "
                "namespace a and next next line from namespace _unnamed_, where ',' separates them"));
  new_options.add(make_option("search_rollout_num_steps", priv.rollout_num_steps)
                      .help("how many calls of \"loss\" before we stop really predicting on rollouts and switch to "
                            "oracle (default means \"infinite\")"));
  new_options.add(make_option("search_history_length", priv.history_length)
                      .keep()
                      .default_value(1)
                      .help("some tasks allow you to specify how much history their depend on; specify that here"));
  new_options.add(make_option("search_no_caching", priv.no_caching)
                      .help("turn off the built-in caching ability (makes things slower, but technically more safe)"));
  new_options.add(
      make_option("search_xv", priv.xv).help("train two separate policies, alternating prediction/learning"));
  new_options.add(make_option("search_perturb_oracle", priv.perturb_oracle)
                      .default_value(0.f)
                      .help("perturb the oracle on rollin with this probability"));
  new_options.add(make_option("search_linear_ordering", priv.linear_ordering)
                      .help("insist on generating examples in linear order (def: hoopla permutation)"));
  new_options.add(make_option("search_active_verify", priv.active_csoaa_verify)
                      .help("verify that active learning is doing the right thing (arg = multiplier, should be = "
                            "cost_range * range_c)"));
  new_options.add(make_option("search_save_every_k_runs", priv.save_every_k_runs).help("save model every k runs"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("search_task"))
    return nullptr;

  search_initialize(&all, *sch.get());

  parse_neighbor_features(neighbor_features_string, *sch.get());

  if (interpolation_string.compare("data") == 0)  // run as dagger
  {
    priv.adaptive_beta = true;
    priv.allow_current_policy = true;
    priv.passes_per_policy = all.numpasses;
    if (priv.current_policy > 1)
      priv.current_policy = 1;
  }
  else if (interpolation_string.compare("policy") == 0)
    ;
  else
    THROW("error: --search_interpolation must be 'data' or 'policy'");

  if ((rollout_string.compare("policy") == 0) || (rollout_string.compare("learn") == 0))
    priv.rollout_method = POLICY;
  else if ((rollout_string.compare("oracle") == 0) || (rollout_string.compare("ref") == 0))
    priv.rollout_method = ORACLE;
  else if ((rollout_string.compare("mix_per_state") == 0))
    priv.rollout_method = MIX_PER_STATE;
  else if ((rollout_string.compare("mix_per_roll") == 0) || (rollout_string.compare("mix") == 0))
    priv.rollout_method = MIX_PER_ROLL;
  else if ((rollout_string.compare("none") == 0))
  {
    priv.rollout_method = NO_ROLLOUT;
    priv.no_caching = true;
  }
  else
    THROW("error: --search_rollout must be 'learn', 'ref', 'mix', 'mix_per_state' or 'none'");

  if ((rollin_string.compare("policy") == 0) || (rollin_string.compare("learn") == 0))
    priv.rollin_method = POLICY;
  else if ((rollin_string.compare("oracle") == 0) || (rollin_string.compare("ref") == 0))
    priv.rollin_method = ORACLE;
  else if ((rollin_string.compare("mix_per_state") == 0))
    priv.rollin_method = MIX_PER_STATE;
  else if ((rollin_string.compare("mix_per_roll") == 0) || (rollin_string.compare("mix") == 0))
    priv.rollin_method = MIX_PER_ROLL;
  else
    THROW("error: --search_rollin must be 'learn', 'ref', 'mix' or 'mix_per_state'");

  // check if the base learner is contextual bandit, in which case, we dont rollout all actions.
  priv.allowed_actions_cache = &calloc_or_throw<polylabel>();
  if (options.was_supplied("cb"))
  {
    priv.cb_learner = true;
    CB::cb_label.default_label(priv.allowed_actions_cache);
    priv.learn_losses.cb.costs = v_init<CB::cb_class>();
    priv.gte_label.cb.costs = v_init<CB::cb_class>();
  }
  else
  {
    priv.cb_learner = false;
    CS::cs_label.default_label(priv.allowed_actions_cache);
    priv.learn_losses.cs.costs = v_init<CS::wclass>();
    priv.gte_label.cs.costs = v_init<CS::wclass>();
  }

  ensure_param(priv.beta, 0.0, 1.0, 0.5, "warning: search_beta must be in (0,1); resetting to 0.5");
  ensure_param(priv.alpha, 0.0, 1.0, 1e-10f, "warning: search_alpha must be in (0,1); resetting to 1e-10");

  priv.num_calls_to_run = 0;

  // compute total number of policies we will have at end of training
  // we add current_policy for cases where we start from an initial set of policies loaded through -i option
  uint32_t tmp_number_of_policies = priv.current_policy;
  if (all.training)
    tmp_number_of_policies += (int)ceil(((float)all.numpasses) / ((float)priv.passes_per_policy));

  // the user might have specified the number of policies that will eventually be trained through multiple vw calls,
  // so only set total_number_of_policies to computed value if it is larger
  cdbg << "current_policy=" << priv.current_policy << " tmp_number_of_policies=" << tmp_number_of_policies
       << " total_number_of_policies=" << priv.total_number_of_policies << endl;
  if (tmp_number_of_policies > priv.total_number_of_policies)
  {
    priv.total_number_of_policies = tmp_number_of_policies;
    if (priv.current_policy >
        0)  // we loaded a file but total number of policies didn't match what is needed for training
      std::cerr << "warning: you're attempting to train more classifiers than was allocated initially. Likely to cause "
                   "bad performance."
                << endl;
  }

  // current policy currently points to a new policy we would train
  // if we are not training and loaded a bunch of policies for testing, we need to subtract 1 from current policy
  // so that we only use those loaded when testing (as run_prediction is called with allow_current to true)
  if (!all.training && priv.current_policy > 0)
    priv.current_policy--;

  all.options->replace("search_trained_nb_policies", std::to_string(priv.current_policy));
  all.options->get_typed_option<uint32_t>("search_trained_nb_policies").value(priv.current_policy);

  all.options->replace("search_total_nb_policies", std::to_string(priv.total_number_of_policies));
  all.options->get_typed_option<uint32_t>("search_total_nb_policies").value(priv.total_number_of_policies);

  cdbg << "search current_policy = " << priv.current_policy
       << " total_number_of_policies = " << priv.total_number_of_policies << endl;

  if (task_string.compare("list") == 0)
  {
    std::cerr << endl << "available search tasks:" << endl;
    for (search_task** mytask = all_tasks; *mytask != nullptr; mytask++)
      std::cerr << "  " << (*mytask)->task_name << endl;
    std::cerr << endl;
    exit(0);
  }
  if (metatask_string.compare("list") == 0)
  {
    std::cerr << endl << "available search metatasks:" << endl;
    for (search_metatask** mytask = all_metatasks; *mytask != nullptr; mytask++)
      std::cerr << "  " << (*mytask)->metatask_name << endl;
    std::cerr << endl;
    exit(0);
  }
  for (search_task** mytask = all_tasks; *mytask != nullptr; mytask++)
    if (task_string.compare((*mytask)->task_name) == 0)
    {
      priv.task = *mytask;
      sch->task_name = (*mytask)->task_name;
      break;
    }
  if (priv.task == nullptr)
  {
    if (!options.was_supplied("help"))
      THROW("fail: unknown task for --search_task '" << task_string << "'; use --search_task list to get a list");
  }
  priv.metatask = nullptr;
  for (search_metatask** mytask = all_metatasks; *mytask != nullptr; mytask++)
    if (metatask_string.compare((*mytask)->metatask_name) == 0)
    {
      priv.metatask = *mytask;
      sch->metatask_name = (*mytask)->metatask_name;
      break;
    }
  all.p->emptylines_separate_examples = true;

  if (!options.was_supplied("csoaa") && !options.was_supplied("cs_active") && !options.was_supplied("csoaa_ldf") &&
      !options.was_supplied("wap_ldf") && !options.was_supplied("cb"))
  {
    options.insert("csoaa", std::to_string(priv.A));
  }

  priv.active_csoaa = options.was_supplied("cs_active");
  priv.active_csoaa_verify = -1.;
  if (options.was_supplied("search_active_verify"))
    if (!priv.active_csoaa)
      THROW("cannot use --search_active_verify without using --cs_active");

  cdbg << "active_csoaa = " << priv.active_csoaa << ", active_csoaa_verify = " << priv.active_csoaa_verify << endl;

  base_learner* base = setup_base(*all.options, all);

  // default to OAA labels unless the task wants to override this (which they can do in initialize)
  all.p->lp = MC::mc_label;
  all.label_type = label_type::mc;
  if (priv.task && priv.task->initialize)
    priv.task->initialize(*sch.get(), priv.A, options);
  if (priv.metatask && priv.metatask->initialize)
    priv.metatask->initialize(*sch.get(), priv.A, options);
  priv.meta_t = 0;

  if (options.was_supplied("search_allowed_transitions"))
    read_allowed_transitions((action)priv.A, search_allowed_transitions.c_str());

  // set up auto-history (used to only do this if AUTO_CONDITION_FEATURES was on, but that doesn't work for hooktask)
  handle_condition_options(all, priv.acset);

  if (!priv.allow_current_policy)  // if we're not dagger
    all.check_holdout_every_n_passes = priv.passes_per_policy;

  all.searchstr = sch.get();

  priv.start_clock_time = clock();

  if (priv.xv)
    priv.num_learners *= 3;

  cdbg << "num_learners = " << priv.num_learners << endl;

  learner<search, multi_ex>& l = init_learner(sch, make_base(*base), do_actual_learning<true>,
      do_actual_learning<false>, priv.total_number_of_policies * priv.num_learners);
  l.set_finish_example(finish_multiline_example);
  l.set_end_examples(end_examples);
  l.set_finish(search_finish);
  l.set_end_pass(end_pass);
  return make_base(l);
}